

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O1

void anon_unknown.dwarf_7e6f::test_art_iterator_prev(void **param_1)

{
  unsigned_long uVar1;
  pointer pVVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  _Bool _Var5;
  allocator_type *__a;
  art_val_t *paVar6;
  pointer pVVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  initializer_list<unsigned_long> __l;
  initializer_list<std::array<unsigned_char,_6UL>_> __l_00;
  initializer_list<(anonymous_namespace)::Value> __l_01;
  vector<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_> keys;
  art_t art;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> values;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sizes;
  art_iterator_t iterator;
  vector<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_> local_108
  ;
  art_t local_f0;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  art_iterator_t local_b8;
  
  local_108.
  super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (array<unsigned_char,_6UL> *)0x0;
  local_108.
  super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (array<unsigned_char,_6UL> *)0x0;
  local_108.
  super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (array<unsigned_char,_6UL> *)0x0;
  local_e8.
  super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.
  super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.depth = '0';
  local_b8.frame = '\0';
  local_b8._18_6_ = 0;
  local_b8.frames[0].node._0_2_ = 0x100;
  local_b8.frames[0].node._2_6_ = 0;
  local_b8.key[0] = '\x04';
  local_b8.key[1] = '\0';
  local_b8.key[2] = '\0';
  local_b8.key[3] = '\0';
  local_b8.key[4] = '\0';
  local_b8.key[5] = '\0';
  local_b8._6_2_ = 0;
  local_b8.value = (art_val_t *)0x10;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_d0,__l,(allocator_type *)&local_f0);
  if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar9 = 0;
    do {
      uVar1 = local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9];
      if ((ulong)(byte)uVar1 != 0) {
        paVar6 = (art_val_t *)0x0;
        uVar10 = 0;
        do {
          uVar4 = local_b8._0_8_;
          local_b8.key._0_4_ = (uint)(byte)uVar9 << 0x18;
          uVar3 = local_b8.key._0_4_;
          local_b8._6_2_ = SUB82(uVar4,6);
          local_b8.key = (art_key_chunk_t  [6])((uint6)CONCAT11((byte)uVar10,(byte)uVar9) << 0x18);
          uVar4 = local_b8._0_8_;
          if (local_108.
              super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_108.
              super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::array<unsigned_char,6ul>,std::allocator<std::array<unsigned_char,6ul>>>
            ::_M_realloc_insert<std::array<unsigned_char,6ul>>
                      ((vector<std::array<unsigned_char,6ul>,std::allocator<std::array<unsigned_char,6ul>>>
                        *)&local_108,
                       (iterator)
                       local_108.
                       super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (array<unsigned_char,_6UL> *)&local_b8);
          }
          else {
            local_b8.key[5] = '\0';
            local_b8.key[4] = (byte)uVar10;
            *(undefined2 *)
             ((local_108.
               super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->_M_elems + 4) = local_b8.key._4_2_;
            *(undefined4 *)
             (local_108.
              super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->_M_elems = uVar3;
            local_108.
            super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_108.
                 super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            local_b8._0_8_ = uVar4;
          }
          local_b8.value = paVar6;
          std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::
          push_back(&local_e8,(value_type *)&local_b8);
          uVar10 = uVar10 + 1;
          paVar6 = (art_val_t *)((long)paVar6->key + uVar9);
        } while ((byte)uVar1 != uVar10);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)local_d0.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_d0.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_f0.root = (art_node_t *)0x0;
  if (local_108.
      super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_108.
      super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar8 = 0;
    uVar9 = 0;
    pVVar7 = local_e8.
             super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      art_insert(&local_f0,
                 (local_108.
                  super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar8,(art_val_t *)pVVar7);
      assert_art_valid((art_t *)&local_f0);
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 6;
      pVVar7 = pVVar7 + 1;
    } while (uVar9 < (ulong)(((long)local_108.
                                    super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_108.
                                    super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 1) *
                            -0x5555555555555555));
  }
  art_init_iterator(&local_b8,&local_f0,false);
  lVar8 = (long)local_108.
                super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_108.
                super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  do {
    assert_key_eq(local_b8.key,
                  local_108.
                  super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[-1]._M_elems + lVar8);
    _Var5 = art_iterator_prev(&local_b8);
    lVar8 = lVar8 + -6;
  } while (_Var5);
  art_free(&local_f0);
  if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.
      super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_108.
      super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (array<unsigned_char,_6UL> *)0x0) {
    operator_delete(local_108.
                    super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_b8.frames[0].index_in_node = '\0';
  local_b8.frames[0]._9_1_ = 0;
  local_b8.frames[0]._10_6_ = 0x10000;
  local_b8.frames[1].node._0_2_ = 0;
  local_b8.depth = '\x01';
  local_b8.frame = '\0';
  local_b8._18_6_ = 0x1000000;
  local_b8.frames[0].node._0_2_ = 0;
  local_b8.frames[0].node._2_6_ = 0x10000000001;
  local_b8.key[0] = '\0';
  local_b8.key[1] = '\0';
  local_b8.key[2] = '\0';
  local_b8.key[3] = '\0';
  local_b8.key[4] = '\0';
  local_b8.key[5] = '\0';
  local_b8._6_2_ = 0;
  local_b8.value = (art_val_t *)0x1000000;
  __a = (allocator_type *)&local_e8;
  __l_00._M_len = 7;
  __l_00._M_array = (iterator)&local_b8;
  std::vector<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>::
  vector(&local_108,__l_00,__a);
  local_b8.value = (art_val_t *)0x0;
  local_b8.frames[0].node._0_2_ = 1;
  local_b8.frames[0].node._2_6_ = 0;
  local_b8.frames[1].node._0_2_ = 2;
  local_b8.frames[1].node._2_6_ = 0;
  local_b8.frames[2].node = (art_node_t *)0x3;
  local_b8.frames[3].node = (art_node_t *)0x4;
  local_b8.frames[4].node = (art_node_t *)0x5;
  local_b8.frames[5].node = (art_node_t *)0x6;
  __l_01._M_len = 7;
  __l_01._M_array = (iterator)&local_b8;
  std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::vector
            (&local_e8,__l_01,(allocator_type *)__a);
  local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if (local_108.
      super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_108.
      super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar8 = 0;
    uVar9 = 0;
    pVVar7 = local_e8.
             super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      art_insert((art_t *)&local_d0,
                 (local_108.
                  super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar8,(art_val_t *)pVVar7);
      assert_art_valid((art_t *)&local_d0);
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 6;
      pVVar7 = pVVar7 + 1;
    } while (uVar9 < (ulong)(((long)local_108.
                                    super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_108.
                                    super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 1) *
                            -0x5555555555555555));
  }
  art_init_iterator(&local_b8,(art_t *)&local_d0,false);
  pVVar2 = local_e8.
           super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar7 = local_e8.
           super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
           ._M_impl.super__Vector_impl_data._M_start +
           ((ulong)((long)local_108.
                          super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_108.
                         super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 1) * -0x555555555555555;
  uVar9 = (long)local_108.
                super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_108.
                super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  do {
    pVVar7 = pVVar7 + -1;
    assert_key_eq(local_b8.key,
                  local_108.
                  super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[-1]._M_elems + uVar9);
    _assert_true((ulong)(pVVar7 == (pointer)local_b8.value),"iterator.value == &values[i]",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
                 ,0x13a);
    _Var5 = art_iterator_prev(&local_b8);
    uVar9 = uVar9 - 6;
  } while (_Var5);
  art_free((art_t *)&local_d0);
  if (pVVar2 != (pointer)0x0) {
    operator_delete(pVVar2);
  }
  if (local_108.
      super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (array<unsigned_char,_6UL> *)0x0) {
    operator_delete(local_108.
                    super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void erase(Key key) {
        art_erase(&art_, key.data());
        shadow_.erase(key);
    }